

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::writeMatrix(BMP *this,ofstream *out)

{
  ostream *poVar1;
  int j;
  long lVar2;
  code *pcVar3;
  int i;
  long lVar4;
  
  pcVar3 = (code *)(out + 0x10);
  if (out == (ofstream *)0x0) {
    pcVar3 = std::__cxx11::string::string;
    out = (ofstream *)&std::cout;
  }
  for (lVar4 = 0; lVar4 < (this->headInfo).biWidth; lVar4 = lVar4 + 1) {
    for (lVar2 = 0; lVar2 < (this->headInfo).biHeight; lVar2 = lVar2 + 1) {
      *(undefined8 *)((ofstream *)pcVar3 + *(long *)(*(long *)out + -0x18)) = 3;
      poVar1 = std::operator<<(out,0x30);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->field[lVar4][lVar2]);
      std::operator<<(poVar1,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)out);
  }
  std::endl<char,std::char_traits<char>>((ostream *)out);
  return;
}

Assistant:

void BMP::writeMatrix(  std::ofstream *out  ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for ( auto i = 0; i < headInfo.biWidth; i++ ) {
        for ( auto j = 0; j < headInfo.biHeight; j++ ) {
            if ( flag ) {
                ( *out ) << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            } else {
                cout << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            }
        }

        if (flag) {
            (*out) << endl;
        } else {
            cout << endl;
        }
    }

    if (flag) {
        (*out) << endl;
    } else {
        cout << endl;
    }
}